

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::noteDefaultDisable(Compilation *this,Scope *scope,Expression *expr)

{
  flat_hash_map<const_Scope_*,_const_Expression_*> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  value_type_pointer ppVar4;
  int iVar5;
  undefined1 auVar6 [16];
  ulong pos0;
  Diagnostic *this_00;
  uint uVar7;
  ulong hash;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  byte bVar14;
  undefined1 auVar15 [16];
  try_emplace_args_t local_71;
  Expression *local_70;
  Scope *local_68;
  ulong local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator res;
  
  arrays_ = &this->defaultDisableMap;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = scope;
  hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->defaultDisableMap).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
                        .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar4 = (this->defaultDisableMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
           .arrays.elements_;
  local_60 = (this->defaultDisableMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
             .arrays.groups_size_mask;
  uVar10 = 0;
  uVar9 = pos0;
  do {
    pgVar2 = (this->defaultDisableMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
             .arrays.groups_ + uVar9;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bStack_49 = pgVar2->m[0xf].n;
    uVar11 = (uchar)uVar3;
    auVar15[0] = -(local_58 == uVar11);
    uVar12 = (uchar)((uint)uVar3 >> 8);
    auVar15[1] = -(uStack_57 == uVar12);
    uVar13 = (uchar)((uint)uVar3 >> 0x10);
    auVar15[2] = -(uStack_56 == uVar13);
    bVar14 = (byte)((uint)uVar3 >> 0x18);
    auVar15[3] = -(bStack_55 == bVar14);
    auVar15[4] = -(uStack_54 == uVar11);
    auVar15[5] = -(uStack_53 == uVar12);
    auVar15[6] = -(uStack_52 == uVar13);
    auVar15[7] = -(bStack_51 == bVar14);
    auVar15[8] = -(uStack_50 == uVar11);
    auVar15[9] = -(uStack_4f == uVar12);
    auVar15[10] = -(uStack_4e == uVar13);
    auVar15[0xb] = -(bStack_4d == bVar14);
    auVar15[0xc] = -(uStack_4c == uVar11);
    auVar15[0xd] = -(uStack_4b == uVar12);
    auVar15[0xe] = -(uStack_4a == uVar13);
    auVar15[0xf] = -(bStack_49 == bVar14);
    for (uVar7 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe); local_70 = expr,
        local_68 = scope, uVar7 != 0; uVar7 = uVar7 - 1 & uVar7) {
      iVar5 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
        }
      }
      if (*(Scope **)((long)&ppVar4[uVar9 * 0xf].first + (ulong)(uint)(iVar5 << 4)) == scope) {
        this_00 = Scope::addDiag(scope,(DiagCode)0x16000d,expr->sourceRange);
        Diagnostic::addNote(this_00,(DiagCode)0xa0001,
                            *(SourceRange *)
                             (*(long *)((long)&ppVar4[uVar9 * 0xf].second +
                                       (ulong)(uint)(iVar5 << 4)) + 0x20));
        return;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_49) == 0) break;
    lVar8 = uVar9 + uVar10;
    uVar10 = uVar10 + 1;
    uVar9 = lVar8 + 1U & local_60;
  } while (uVar10 <= local_60);
  if ((this->defaultDisableMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
      .size_ctrl.size <
      (this->defaultDisableMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Expression_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Scope_const*,slang::ast::Expression_const*>
              (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Expression_const*>>>
                     *)arrays_,(arrays_type *)arrays_,pos0,hash,&local_71,&local_68,&local_70);
    psVar1 = &(this->defaultDisableMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Expression_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Scope_const*,slang::ast::Expression_const*>
              (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Expression_const*>>>
                     *)arrays_,hash,&local_71,&local_68,&local_70);
  }
  return;
}

Assistant:

void Compilation::noteDefaultDisable(const Scope& scope, const Expression& expr) {
    SLANG_ASSERT(!isFrozen());

    auto [it, inserted] = defaultDisableMap.emplace(&scope, &expr);
    if (!inserted) {
        auto& diag = scope.addDiag(diag::MultipleDefaultDisable, expr.sourceRange);
        diag.addNote(diag::NotePreviousDefinition, it->second->sourceRange);
    }
}